

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub,UA_UInt32 sequenceNumber)

{
  UA_NotificationMessageEntry *pUVar1;
  UA_NotificationMessageEntry **ppUVar2;
  anon_struct_16_2_4dd83919_for_listEntry *paVar3;
  UA_NotificationMessageEntry *__ptr;
  
  pUVar1 = (sub->retransmissionQueue).tqh_first;
  do {
    __ptr = pUVar1;
    if (__ptr == (UA_NotificationMessageEntry *)0x0) {
      return 0x807a0000;
    }
    pUVar1 = (__ptr->listEntry).tqe_next;
  } while ((__ptr->message).sequenceNumber != sequenceNumber);
  ppUVar2 = (__ptr->listEntry).tqe_prev;
  paVar3 = &pUVar1->listEntry;
  if (pUVar1 == (UA_NotificationMessageEntry *)0x0) {
    paVar3 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
  }
  paVar3->tqe_prev = ppUVar2;
  *ppUVar2 = pUVar1;
  sub->retransmissionQueueSize = sub->retransmissionQueueSize - 1;
  UA_NotificationMessage_deleteMembers(&__ptr->message);
  free(__ptr);
  return 0;
}

Assistant:

UA_StatusCode
UA_Subscription_removeRetransmissionMessage(UA_Subscription *sub, UA_UInt32 sequenceNumber) {
    UA_NotificationMessageEntry *entry, *entry_tmp;
    TAILQ_FOREACH_SAFE(entry, &sub->retransmissionQueue, listEntry, entry_tmp) {
        if(entry->message.sequenceNumber != sequenceNumber)
            continue;
        TAILQ_REMOVE(&sub->retransmissionQueue, entry, listEntry);
        --sub->retransmissionQueueSize;
        UA_NotificationMessage_deleteMembers(&entry->message);
        UA_free(entry);
        return UA_STATUSCODE_GOOD;
    }
    return UA_STATUSCODE_BADSEQUENCENUMBERUNKNOWN;
}